

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.c
# Opt level: O1

ch_string * register_allocated_string(ch_context *vm,char *value,size_t size)

{
  uint32_t uVar1;
  ch_string *key;
  
  key = ch_table_find_string(&vm->strings,value,size);
  if (key == (ch_string *)0x0) {
    key = (ch_string *)malloc(0x18);
    key->value = value;
    key->size = (uint32_t)size;
    uVar1 = ch_hash_string(value,size);
    key->hash = uVar1;
    (key->object).type = TYPE_STRING;
    ch_table_set(&vm->strings,key,(ch_primitive)ZEXT816(2));
  }
  else {
    free(value);
  }
  return key;
}

Assistant:

static ch_string *register_allocated_string(ch_context* vm, char* value, size_t size) {
  ch_string *interned_string = ch_table_find_string(&vm->strings, value, size);
  if (interned_string != NULL) {
    free(value);
    return interned_string;
  }

  ch_string *string = new_string(value, size);
  ch_table_set(&vm->strings, string, MAKE_NULL());

  return string;
}